

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::PointRenderCase::renderTestPattern
          (PointRenderCase *this,IterationConfig *config)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  undefined8 uVar5;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  long lVar4;
  
  iVar2 = (*((this->super_BBoxRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  BBoxRenderCase::setupRender(&this->super_BBoxRenderCase,config);
  if ((this->super_BBoxRenderCase).m_hasTessellationStage == true) {
    iVar2 = (**(code **)(lVar4 + 0xb48))
                      ((((this->super_BBoxRenderCase).m_program.
                         super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                         .m_data.ptr)->m_program).m_program);
    if (iVar2 == -1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"tessLevelPos != -1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                 ,0xaf1);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_1a0._0_8_ =
         ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"u_tessellationLevel = ",0x16);
    std::ostream::_M_insert<double>(0.800000011920929);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_128);
    (**(code **)(lVar4 + 0x14e0))(0x3f4ccccd,iVar2);
    (**(code **)(lVar4 + 0xfd8))(0x8e72,1);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"patch param",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xaf7);
  }
  local_1a0._0_8_ =
       ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Rendering pattern.",0x12);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_128);
  (**(code **)(lVar4 + 0x5e0))(0xbe2);
  (**(code **)(lVar4 + 0x120))(1,1);
  (**(code **)(lVar4 + 0x100))(0x8006);
  uVar5 = 0xe;
  if ((this->super_BBoxRenderCase).m_hasTessellationStage == false) {
    uVar5 = 0;
  }
  iVar2 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
  (**(code **)(lVar4 + 0x538))(uVar5,0,iVar2 * iVar2 * 2);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0xb01);
  return;
}

Assistant:

void PointRenderCase::renderTestPattern (const IterationConfig& config)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	setupRender(config);

	if (m_hasTessellationStage)
	{
		const glw::GLint	tessLevelPos	= gl.getUniformLocation(m_program->getProgram(), "u_tessellationLevel");
		const glw::GLfloat	tessLevel		= 0.8f; // will be rounded up

		TCU_CHECK(tessLevelPos != -1);

		m_testCtx.getLog() << tcu::TestLog::Message << "u_tessellationLevel = " << tessLevel << tcu::TestLog::EndMessage;

		gl.uniform1f(tessLevelPos, tessLevel);
		gl.patchParameteri(GL_PATCH_VERTICES, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "patch param");
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering pattern." << tcu::TestLog::EndMessage;

	gl.enable(GL_BLEND);
	gl.blendFunc(GL_ONE, GL_ONE);
	gl.blendEquation(GL_FUNC_ADD);

	gl.drawArrays((m_hasTessellationStage) ? (GL_PATCHES) : (GL_POINTS), 0, m_numStripes * m_numStripes * 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "draw");
}